

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O0

void amrex::FillSignedDistance(MultiFab *mf,bool fluid_has_positive_sign)

{
  FabFactory<amrex::FArrayBox> *pFVar1;
  value_type in_RDI;
  EBFArrayBoxFactory *factory;
  undefined1 in_stack_0000069b;
  int in_stack_0000069c;
  EBFArrayBoxFactory *in_stack_000006a0;
  Level *in_stack_000006a8;
  MultiFab *in_stack_000006b0;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffffd0;
  EBFArrayBoxFactory *local_28;
  
  pFVar1 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x142befc);
  if (pFVar1 == (FabFactory<amrex::FArrayBox> *)0x0) {
    local_28 = (EBFArrayBoxFactory *)0x0;
  }
  else {
    local_28 = (EBFArrayBoxFactory *)
               __dynamic_cast(pFVar1,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
  }
  if (local_28 == (EBFArrayBoxFactory *)0x0) {
    std::numeric_limits<double>::max();
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(in_stack_ffffffffffffffd0,in_RDI);
  }
  else {
    EBFArrayBoxFactory::getEBLevel(local_28);
    FillSignedDistance(in_stack_000006b0,in_stack_000006a8,in_stack_000006a0,in_stack_0000069c,
                       (bool)in_stack_0000069b);
  }
  return;
}

Assistant:

void FillSignedDistance (MultiFab& mf, bool fluid_has_positive_sign)
{
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory) {
        FillSignedDistance(mf, *(factory->getEBLevel()), *factory, 1, fluid_has_positive_sign);
    } else {
        mf.setVal(std::numeric_limits<Real>::max());
    }
}